

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O0

void __thiscall OPL3::OPL3(OPL3 *this,bool fullpan)

{
  OPL3DataStruct *this_00;
  OperatorDataStruct *this_01;
  int iVar1;
  bool bVar2;
  double local_70;
  double local_58;
  double local_40;
  bool fullpan_local;
  OPL3 *this_local;
  
  OPLEmul::OPLEmul(&this->super_OPLEmul);
  (this->super_OPLEmul)._vptr_OPLEmul = (_func_int **)&PTR__OPL3_009ef2b8;
  DisabledChannel::DisabledChannel(&this->disabledChannel);
  HighHatOperator::HighHatOperator(&this->highHatOperator);
  SnareDrumOperator::SnareDrumOperator(&this->snareDrumOperator);
  TomTomOperator::TomTomOperator(&this->tomTomOperator);
  local_40 = 0.70710678118;
  if (!fullpan) {
    local_40 = 1.0;
  }
  TomTomTopCymbalChannel::TomTomTopCymbalChannel
            (&this->tomTomTopCymbalChannel,local_40,&(this->tomTomOperator).super_Operator,
             &(this->topCymbalOperator).super_Operator);
  local_58 = 0.70710678118;
  if (!fullpan) {
    local_58 = 1.0;
  }
  BassDrumChannel::BassDrumChannel(&this->bassDrumChannel,local_58);
  local_70 = 0.70710678118;
  if (!fullpan) {
    local_70 = 1.0;
  }
  HighHatSnareDrumChannel::HighHatSnareDrumChannel
            (&this->highHatSnareDrumChannel,local_70,(Operator *)&this->highHatOperator,
             &(this->snareDrumOperator).super_Operator);
  TopCymbalOperator::TopCymbalOperator(&this->topCymbalOperator);
  this->FullPan = fullpan;
  this->connectionsel = 0;
  this->_new = 0;
  this->hh = 0;
  this->tc = 0;
  this->tom = 0;
  this->sd = 0;
  this->bd = 0;
  this->ryt = 0;
  this->dvb = 0;
  this->dam = 0;
  this->nts = 0;
  this->tremoloIndex = 0;
  this->vibratoIndex = 0;
  iVar1 = InstanceCount + 1;
  bVar2 = InstanceCount == 0;
  InstanceCount = iVar1;
  if (bVar2) {
    this_00 = (OPL3DataStruct *)operator_new(0x547c0);
    OPL3DataStruct::OPL3DataStruct(this_00);
    OPL3Data = this_00;
    this_01 = (OperatorDataStruct *)operator_new(0x11c00);
    OperatorDataStruct::OperatorDataStruct(this_01);
    OperatorData = this_01;
  }
  initOperators(this);
  initChannels2op(this);
  initChannels4op(this);
  initRhythmChannels(this);
  initChannels(this);
  return;
}

Assistant:

OPL3::OPL3(bool fullpan)
: tomTomTopCymbalChannel(fullpan ? CENTER_PANNING_POWER : 1, &tomTomOperator, &topCymbalOperator),
  bassDrumChannel(fullpan ? CENTER_PANNING_POWER : 1),
  highHatSnareDrumChannel(fullpan ? CENTER_PANNING_POWER : 1, &highHatOperator, &snareDrumOperator)
{
	FullPan = fullpan;
    nts = dam = dvb = ryt = bd = sd = tom = tc = hh = _new = connectionsel = 0;
    vibratoIndex = tremoloIndex = 0; 

	if (InstanceCount++ == 0)
	{
		OPL3Data = new struct OPL3DataStruct;
		OperatorData = new struct OperatorDataStruct;
	}

    initOperators();
    initChannels2op();
    initChannels4op();
    initRhythmChannels();
    initChannels();
}